

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::getPartials
          (BeagleCPUImpl<float,_1,_0> *this,int bufferIndex,int cumulativeScaleIndex,
          double *outPartials)

{
  float *pfVar1;
  double *pdVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  float *pfVar17;
  uint uVar18;
  ulong uVar19;
  int iVar20;
  double *pdVar21;
  long lVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  double dVar29;
  
  iVar16 = -5;
  if ((-1 < bufferIndex) && (iVar16 = -5, bufferIndex < *(int *)&(this->super_BeagleImpl).field_0xc)
     ) {
    iVar16 = this->kPaddedPatternCount;
    uVar18 = this->kStateCount;
    iVar3 = this->kPatternCount;
    uVar4 = this->kPartialsPaddedStateCount;
    if (uVar18 == uVar4 && iVar16 == iVar3) {
      uVar18 = this->kPartialsSize;
      if ((ulong)uVar18 != 0) {
        auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        pfVar17 = this->gPartials[(uint)bufferIndex];
        auVar27 = vpbroadcastq_avx512f();
        uVar19 = 0;
        do {
          auVar28 = vpbroadcastq_avx512f();
          auVar28 = vporq_avx512f(auVar28,auVar26);
          uVar13 = vpcmpuq_avx512f(auVar28,auVar27,2);
          pfVar1 = pfVar17 + uVar19;
          auVar23._4_4_ = (uint)((byte)(uVar13 >> 1) & 1) * (int)pfVar1[1];
          auVar23._0_4_ = (uint)((byte)uVar13 & 1) * (int)*pfVar1;
          auVar23._8_4_ = (uint)((byte)(uVar13 >> 2) & 1) * (int)pfVar1[2];
          auVar23._12_4_ = (uint)((byte)(uVar13 >> 3) & 1) * (int)pfVar1[3];
          auVar23._16_4_ = (uint)((byte)(uVar13 >> 4) & 1) * (int)pfVar1[4];
          auVar23._20_4_ = (uint)((byte)(uVar13 >> 5) & 1) * (int)pfVar1[5];
          auVar23._24_4_ = (uint)((byte)(uVar13 >> 6) & 1) * (int)pfVar1[6];
          auVar23._28_4_ = (uint)(byte)(uVar13 >> 7) * (int)pfVar1[7];
          auVar28 = vcvtps2pd_avx512f(auVar23);
          pdVar21 = outPartials + uVar19;
          bVar6 = (bool)((byte)uVar13 & 1);
          bVar7 = (bool)((byte)(uVar13 >> 1) & 1);
          bVar8 = (bool)((byte)(uVar13 >> 2) & 1);
          bVar9 = (bool)((byte)(uVar13 >> 3) & 1);
          bVar10 = (bool)((byte)(uVar13 >> 4) & 1);
          bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
          bVar12 = (bool)((byte)(uVar13 >> 6) & 1);
          *pdVar21 = (double)((ulong)bVar6 * auVar28._0_8_ | (ulong)!bVar6 * (long)*pdVar21);
          pdVar21[1] = (double)((ulong)bVar7 * auVar28._8_8_ | (ulong)!bVar7 * (long)pdVar21[1]);
          pdVar21[2] = (double)((ulong)bVar8 * auVar28._16_8_ | (ulong)!bVar8 * (long)pdVar21[2]);
          pdVar21[3] = (double)((ulong)bVar9 * auVar28._24_8_ | (ulong)!bVar9 * (long)pdVar21[3]);
          pdVar21[4] = (double)((ulong)bVar10 * auVar28._32_8_ | (ulong)!bVar10 * (long)pdVar21[4]);
          pdVar21[5] = (double)((ulong)bVar11 * auVar28._40_8_ | (ulong)!bVar11 * (long)pdVar21[5]);
          pdVar21[6] = (double)((ulong)bVar12 * auVar28._48_8_ | (ulong)!bVar12 * (long)pdVar21[6]);
          pdVar21[7] = (double)((uVar13 >> 7) * auVar28._56_8_ |
                               (ulong)!SUB81(uVar13 >> 7,0) * (long)pdVar21[7]);
          uVar19 = uVar19 + 8;
        } while (((ulong)uVar18 + 7 & 0xfffffffffffffff8) != uVar19);
      }
    }
    else {
      iVar5 = this->kCategoryCount;
      if (uVar18 == uVar4) {
        if (0 < iVar5) {
          auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          pfVar17 = this->gPartials[(uint)bufferIndex];
          uVar18 = uVar4 * iVar3;
          auVar27 = vpbroadcastq_avx512f();
          iVar20 = 0;
          pdVar21 = outPartials;
          do {
            if (uVar18 != 0) {
              uVar19 = 0;
              do {
                auVar28 = vpbroadcastq_avx512f();
                auVar28 = vporq_avx512f(auVar28,auVar26);
                uVar13 = vpcmpuq_avx512f(auVar28,auVar27,2);
                pfVar1 = pfVar17 + uVar19;
                auVar24._4_4_ = (uint)((byte)(uVar13 >> 1) & 1) * (int)pfVar1[1];
                auVar24._0_4_ = (uint)((byte)uVar13 & 1) * (int)*pfVar1;
                auVar24._8_4_ = (uint)((byte)(uVar13 >> 2) & 1) * (int)pfVar1[2];
                auVar24._12_4_ = (uint)((byte)(uVar13 >> 3) & 1) * (int)pfVar1[3];
                auVar24._16_4_ = (uint)((byte)(uVar13 >> 4) & 1) * (int)pfVar1[4];
                auVar24._20_4_ = (uint)((byte)(uVar13 >> 5) & 1) * (int)pfVar1[5];
                auVar24._24_4_ = (uint)((byte)(uVar13 >> 6) & 1) * (int)pfVar1[6];
                auVar24._28_4_ = (uint)(byte)(uVar13 >> 7) * (int)pfVar1[7];
                auVar28 = vcvtps2pd_avx512f(auVar24);
                pdVar2 = pdVar21 + uVar19;
                bVar6 = (bool)((byte)uVar13 & 1);
                bVar7 = (bool)((byte)(uVar13 >> 1) & 1);
                bVar8 = (bool)((byte)(uVar13 >> 2) & 1);
                bVar9 = (bool)((byte)(uVar13 >> 3) & 1);
                bVar10 = (bool)((byte)(uVar13 >> 4) & 1);
                bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
                bVar12 = (bool)((byte)(uVar13 >> 6) & 1);
                *pdVar2 = (double)((ulong)bVar6 * auVar28._0_8_ | (ulong)!bVar6 * (long)*pdVar2);
                pdVar2[1] = (double)((ulong)bVar7 * auVar28._8_8_ | (ulong)!bVar7 * (long)pdVar2[1])
                ;
                pdVar2[2] = (double)((ulong)bVar8 * auVar28._16_8_ | (ulong)!bVar8 * (long)pdVar2[2]
                                    );
                pdVar2[3] = (double)((ulong)bVar9 * auVar28._24_8_ | (ulong)!bVar9 * (long)pdVar2[3]
                                    );
                pdVar2[4] = (double)((ulong)bVar10 * auVar28._32_8_ |
                                    (ulong)!bVar10 * (long)pdVar2[4]);
                pdVar2[5] = (double)((ulong)bVar11 * auVar28._40_8_ |
                                    (ulong)!bVar11 * (long)pdVar2[5]);
                pdVar2[6] = (double)((ulong)bVar12 * auVar28._48_8_ |
                                    (ulong)!bVar12 * (long)pdVar2[6]);
                pdVar2[7] = (double)((uVar13 >> 7) * auVar28._56_8_ |
                                    (ulong)!SUB81(uVar13 >> 7,0) * (long)pdVar2[7]);
                uVar19 = uVar19 + 8;
              } while (((ulong)uVar18 + 7 & 0xfffffffffffffff8) != uVar19);
            }
            iVar20 = iVar20 + 1;
            pfVar17 = pfVar17 + (int)(iVar16 * uVar4);
            pdVar21 = pdVar21 + (int)uVar18;
          } while (iVar20 != iVar5);
        }
      }
      else if (0 < iVar5) {
        auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        pfVar17 = this->gPartials[(uint)bufferIndex];
        auVar27 = vpbroadcastq_avx512f();
        iVar20 = 0;
        pdVar21 = outPartials;
        do {
          if (0 < iVar3) {
            iVar15 = 0;
            do {
              if ((ulong)uVar18 != 0) {
                uVar19 = 0;
                do {
                  auVar28 = vpbroadcastq_avx512f();
                  auVar28 = vporq_avx512f(auVar28,auVar26);
                  uVar13 = vpcmpuq_avx512f(auVar28,auVar27,2);
                  pfVar1 = pfVar17 + uVar19;
                  auVar25._4_4_ = (uint)((byte)(uVar13 >> 1) & 1) * (int)pfVar1[1];
                  auVar25._0_4_ = (uint)((byte)uVar13 & 1) * (int)*pfVar1;
                  auVar25._8_4_ = (uint)((byte)(uVar13 >> 2) & 1) * (int)pfVar1[2];
                  auVar25._12_4_ = (uint)((byte)(uVar13 >> 3) & 1) * (int)pfVar1[3];
                  auVar25._16_4_ = (uint)((byte)(uVar13 >> 4) & 1) * (int)pfVar1[4];
                  auVar25._20_4_ = (uint)((byte)(uVar13 >> 5) & 1) * (int)pfVar1[5];
                  auVar25._24_4_ = (uint)((byte)(uVar13 >> 6) & 1) * (int)pfVar1[6];
                  auVar25._28_4_ = (uint)(byte)(uVar13 >> 7) * (int)pfVar1[7];
                  auVar28 = vcvtps2pd_avx512f(auVar25);
                  pdVar2 = pdVar21 + uVar19;
                  bVar6 = (bool)((byte)uVar13 & 1);
                  bVar7 = (bool)((byte)(uVar13 >> 1) & 1);
                  bVar8 = (bool)((byte)(uVar13 >> 2) & 1);
                  bVar9 = (bool)((byte)(uVar13 >> 3) & 1);
                  bVar10 = (bool)((byte)(uVar13 >> 4) & 1);
                  bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
                  bVar12 = (bool)((byte)(uVar13 >> 6) & 1);
                  *pdVar2 = (double)((ulong)bVar6 * auVar28._0_8_ | (ulong)!bVar6 * (long)*pdVar2);
                  pdVar2[1] = (double)((ulong)bVar7 * auVar28._8_8_ |
                                      (ulong)!bVar7 * (long)pdVar2[1]);
                  pdVar2[2] = (double)((ulong)bVar8 * auVar28._16_8_ |
                                      (ulong)!bVar8 * (long)pdVar2[2]);
                  pdVar2[3] = (double)((ulong)bVar9 * auVar28._24_8_ |
                                      (ulong)!bVar9 * (long)pdVar2[3]);
                  pdVar2[4] = (double)((ulong)bVar10 * auVar28._32_8_ |
                                      (ulong)!bVar10 * (long)pdVar2[4]);
                  pdVar2[5] = (double)((ulong)bVar11 * auVar28._40_8_ |
                                      (ulong)!bVar11 * (long)pdVar2[5]);
                  pdVar2[6] = (double)((ulong)bVar12 * auVar28._48_8_ |
                                      (ulong)!bVar12 * (long)pdVar2[6]);
                  pdVar2[7] = (double)((uVar13 >> 7) * auVar28._56_8_ |
                                      (ulong)!SUB81(uVar13 >> 7,0) * (long)pdVar2[7]);
                  uVar19 = uVar19 + 8;
                } while (((ulong)uVar18 + 7 & 0xfffffffffffffff8) != uVar19);
              }
              pdVar21 = pdVar21 + (int)uVar18;
              pfVar17 = pfVar17 + (int)uVar4;
              iVar15 = iVar15 + 1;
            } while (iVar15 != iVar3);
          }
          pfVar17 = pfVar17 + (int)((iVar16 - iVar3) * uVar4);
          iVar20 = iVar20 + 1;
        } while (iVar20 != iVar5);
      }
    }
    iVar16 = 0;
    if ((cumulativeScaleIndex != -1) && (0 < iVar3)) {
      lVar22 = 0;
      iVar16 = 0;
      pfVar17 = this->gScaleBuffers[cumulativeScaleIndex];
      do {
        dVar29 = exp((double)pfVar17[lVar22]);
        iVar3 = this->kStateCount;
        if (0 < iVar3) {
          lVar14 = 0;
          do {
            outPartials[iVar16 + lVar14] = (double)(float)dVar29 * outPartials[iVar16 + lVar14];
            lVar14 = lVar14 + 1;
          } while (iVar3 != (int)lVar14);
          iVar16 = iVar16 + (int)lVar14;
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 < this->kPatternCount);
      iVar16 = 0;
    }
  }
  return iVar16;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::getPartials(int bufferIndex,
                               int cumulativeScaleIndex,
                               double* outPartials) {

    // TODO: Test with and without padding
    if (bufferIndex < 0 || bufferIndex >= kBufferCount)
        return BEAGLE_ERROR_OUT_OF_RANGE;

    if ((kPatternCount == kPaddedPatternCount) && (kStateCount == kPartialsPaddedStateCount)) {
        beagleMemCpy(outPartials, gPartials[bufferIndex], kPartialsSize);
    } else if (kStateCount == kPartialsPaddedStateCount) {
        double *offsetOutPartials = outPartials;
        REALTYPE* offsetBeaglePartials = gPartials[bufferIndex];
        for(int l = 0; l < kCategoryCount; l++) {
            beagleMemCpy(offsetOutPartials, offsetBeaglePartials, kPatternCount * kStateCount);
            offsetOutPartials += kPatternCount * kStateCount;
            offsetBeaglePartials += kPaddedPatternCount * kStateCount;
        }
    } else {
        double *offsetOutPartials = outPartials;
        REALTYPE* offsetBeaglePartials = gPartials[bufferIndex];
        for(int l = 0; l < kCategoryCount; l++) {
            for (int i = 0; i < kPatternCount; i++) {
                beagleMemCpy(offsetOutPartials, offsetBeaglePartials, kStateCount);
                offsetOutPartials += kStateCount;
                offsetBeaglePartials += kPartialsPaddedStateCount;
            }
            offsetBeaglePartials += (kPaddedPatternCount - kPatternCount) * kPartialsPaddedStateCount;
        }
    }

    if (cumulativeScaleIndex != BEAGLE_OP_NONE) {
        REALTYPE* cumulativeScaleBuffer = gScaleBuffers[cumulativeScaleIndex];
        int index = 0;
        for(int k=0; k<kPatternCount; k++) {
            REALTYPE scaleFactor = exp(cumulativeScaleBuffer[k]);
            for(int i=0; i<kStateCount; i++) {
                outPartials[index] *= scaleFactor;
                index++;
            }
        }
        // TODO: Do we assume the cumulativeScaleBuffer is on the log-scale?
    }

    return BEAGLE_SUCCESS;
}